

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_invert.c
# Opt level: O1

void crypto_sign_ed25519_ref10_fe_invert(int32_t *out,int32_t *z)

{
  int iVar1;
  fe t2;
  fe t1;
  fe t3;
  fe t0;
  int32_t aiStack_e8 [12];
  int32_t local_b8 [12];
  int32_t local_88 [12];
  int32_t local_58 [12];
  
  crypto_sign_ed25519_ref10_fe_sq(local_58,z);
  crypto_sign_ed25519_ref10_fe_sq(local_b8,local_58);
  crypto_sign_ed25519_ref10_fe_sq(local_b8,local_b8);
  crypto_sign_ed25519_ref10_fe_mul(local_b8,z,local_b8);
  crypto_sign_ed25519_ref10_fe_mul(local_58,local_58,local_b8);
  crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,local_58);
  crypto_sign_ed25519_ref10_fe_mul(local_b8,local_b8,aiStack_e8);
  crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,local_b8);
  iVar1 = 4;
  do {
    crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,aiStack_e8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(local_b8,aiStack_e8,local_b8);
  crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,local_b8);
  iVar1 = 9;
  do {
    crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,aiStack_e8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(aiStack_e8,aiStack_e8,local_b8);
  crypto_sign_ed25519_ref10_fe_sq(local_88,aiStack_e8);
  iVar1 = 0x13;
  do {
    crypto_sign_ed25519_ref10_fe_sq(local_88,local_88);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(aiStack_e8,local_88,aiStack_e8);
  crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,aiStack_e8);
  iVar1 = 9;
  do {
    crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,aiStack_e8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(local_b8,aiStack_e8,local_b8);
  crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,local_b8);
  iVar1 = 0x31;
  do {
    crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,aiStack_e8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(aiStack_e8,aiStack_e8,local_b8);
  crypto_sign_ed25519_ref10_fe_sq(local_88,aiStack_e8);
  iVar1 = 99;
  do {
    crypto_sign_ed25519_ref10_fe_sq(local_88,local_88);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(aiStack_e8,local_88,aiStack_e8);
  crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,aiStack_e8);
  iVar1 = 0x31;
  do {
    crypto_sign_ed25519_ref10_fe_sq(aiStack_e8,aiStack_e8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(local_b8,aiStack_e8,local_b8);
  crypto_sign_ed25519_ref10_fe_sq(local_b8,local_b8);
  iVar1 = 4;
  do {
    crypto_sign_ed25519_ref10_fe_sq(local_b8,local_b8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  crypto_sign_ed25519_ref10_fe_mul(out,local_b8,local_58);
  return;
}

Assistant:

void fe_invert(fe out,const fe z)
{
  fe t0;
  fe t1;
  fe t2;
  fe t3;
  int i;

#include "pow225521.h"

  return;
}